

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmForEachCommand.cxx
# Opt level: O3

bool __thiscall
cmForEachFunctionBlocker::IsFunctionBlocked
          (cmForEachFunctionBlocker *this,cmListFileFunction *lff,cmMakefile *mf,
          cmExecutionStatus *inStatus)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  char *__s;
  pointer pcVar4;
  string *psVar5;
  uint uVar6;
  ulong uVar7;
  string *name;
  string oldDef;
  cmExecutionStatus local_5c;
  _Map_pointer local_58;
  _Map_pointer local_50;
  char *local_48;
  undefined1 local_40;
  undefined7 uStack_3f;
  
  iVar2 = cmsys::SystemTools::Strucmp((lff->super_cmCommandContext).Name._M_dataplus._M_p,"foreach")
  ;
  if (iVar2 == 0) {
    this->Depth = this->Depth + 1;
  }
  else {
    iVar2 = cmsys::SystemTools::Strucmp
                      ((lff->super_cmCommandContext).Name._M_dataplus._M_p,"endforeach");
    if (iVar2 == 0) {
      if (this->Depth == 0) {
        cmMakefile::RemoveFunctionBlocker
                  ((cmMakefile *)&stack0xffffffffffffffb0,(cmFunctionBlocker *)mf,
                   (cmListFileFunction *)this);
        if (local_50 == (_Map_pointer)0x0) {
          return false;
        }
        local_58 = local_50;
        local_50 = (_Map_pointer)&stack0xffffffffffffffc0;
        local_48 = (char *)0x0;
        local_40 = 0;
        pcVar3 = cmMakefile::GetDefinition
                           (mf,(this->Args).
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start);
        if (pcVar3 != (char *)0x0) {
          __s = cmMakefile::GetDefinition
                          (mf,(this->Args).
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start);
          pcVar3 = local_48;
          strlen(__s);
          std::__cxx11::string::_M_replace((ulong)&stack0xffffffffffffffb0,0,pcVar3,(ulong)__s);
        }
        name = (this->Args).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
        psVar5 = name + 1;
        if (psVar5 != (this->Args).
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish) {
          do {
            cmMakefile::AddDefinition
                      (mf,(this->Args).
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start,(psVar5->_M_dataplus)._M_p);
            pcVar4 = (this->Functions).
                     super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>.
                     _M_impl.super__Vector_impl_data._M_start;
            if ((this->Functions).
                super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>._M_impl.
                super__Vector_impl_data._M_finish != pcVar4) {
              uVar6 = 1;
              uVar7 = 0;
              do {
                local_5c.ReturnInvoked = false;
                local_5c.BreakInvoked = false;
                local_5c.ContinueInvoked = false;
                local_5c.NestedError = false;
                cmMakefile::ExecuteCommand(mf,pcVar4 + uVar7,&local_5c);
                if (local_5c.ReturnInvoked == true) {
                  inStatus->ReturnInvoked = true;
LAB_0031256f:
                  cmMakefile::AddDefinition
                            (mf,(this->Args).
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start,(char *)local_50);
                  goto LAB_00312580;
                }
                if (local_5c.BreakInvoked != false) goto LAB_0031256f;
                if (local_5c.ContinueInvoked != false) break;
                if ((cmSystemTools::s_FatalErrorOccured != false) ||
                   (bVar1 = cmSystemTools::GetInterruptFlag(), bVar1)) goto LAB_00312580;
                uVar7 = (ulong)uVar6;
                pcVar4 = (this->Functions).
                         super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>
                         ._M_impl.super__Vector_impl_data._M_start;
                uVar6 = uVar6 + 1;
              } while (uVar7 < (ulong)((long)(this->Functions).
                                             super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>
                                             ._M_impl.super__Vector_impl_data._M_finish -
                                       (long)pcVar4 >> 6));
            }
            psVar5 = psVar5 + 1;
          } while (psVar5 != (this->Args).
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish);
          name = (this->Args).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        }
        cmMakefile::AddDefinition(mf,name,(char *)local_50);
LAB_00312580:
        if (local_50 != (_Map_pointer)&stack0xffffffffffffffc0) {
          operator_delete(local_50,CONCAT71(uStack_3f,local_40) + 1);
        }
        (**(code **)((long)&(*local_58)->field_2 + 8))();
        return true;
      }
      this->Depth = this->Depth + -1;
    }
  }
  std::vector<cmListFileFunction,_std::allocator<cmListFileFunction>_>::push_back
            (&this->Functions,lff);
  return true;
}

Assistant:

bool cmForEachFunctionBlocker::IsFunctionBlocked(const cmListFileFunction& lff,
                                                 cmMakefile& mf,
                                                 cmExecutionStatus& inStatus)
{
  if (!cmSystemTools::Strucmp(lff.Name.c_str(), "foreach")) {
    // record the number of nested foreach commands
    this->Depth++;
  } else if (!cmSystemTools::Strucmp(lff.Name.c_str(), "endforeach")) {
    // if this is the endofreach for this statement
    if (!this->Depth) {
      // Remove the function blocker for this scope or bail.
      CM_AUTO_PTR<cmFunctionBlocker> fb(mf.RemoveFunctionBlocker(this, lff));
      if (!fb.get()) {
        return false;
      }

      // at end of for each execute recorded commands
      // store the old value
      std::string oldDef;
      if (mf.GetDefinition(this->Args[0])) {
        oldDef = mf.GetDefinition(this->Args[0]);
      }
      std::vector<std::string>::const_iterator j = this->Args.begin();
      ++j;

      for (; j != this->Args.end(); ++j) {
        // set the variable to the loop value
        mf.AddDefinition(this->Args[0], j->c_str());
        // Invoke all the functions that were collected in the block.
        cmExecutionStatus status;
        for (unsigned int c = 0; c < this->Functions.size(); ++c) {
          status.Clear();
          mf.ExecuteCommand(this->Functions[c], status);
          if (status.GetReturnInvoked()) {
            inStatus.SetReturnInvoked();
            // restore the variable to its prior value
            mf.AddDefinition(this->Args[0], oldDef.c_str());
            return true;
          }
          if (status.GetBreakInvoked()) {
            // restore the variable to its prior value
            mf.AddDefinition(this->Args[0], oldDef.c_str());
            return true;
          }
          if (status.GetContinueInvoked()) {
            break;
          }
          if (cmSystemTools::GetFatalErrorOccured()) {
            return true;
          }
        }
      }

      // restore the variable to its prior value
      mf.AddDefinition(this->Args[0], oldDef.c_str());
      return true;
    }
    // close out a nested foreach
    this->Depth--;
  }

  // record the command
  this->Functions.push_back(lff);

  // always return true
  return true;
}